

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O2

IXML_Node_conflict * ixmlNamedNodeMap_getNamedItem(IXML_NamedNodeMap *nnMap,char *name)

{
  int iVar1;
  IXML_Node_conflict *pIVar2;
  IXML_NamedNodeMap *pIVar3;
  long lVar4;
  
  if (name != (char *)0x0 && nnMap != (IXML_NamedNodeMap *)0x0) {
    lVar4 = 0;
    pIVar3 = nnMap;
    while (pIVar2 = pIVar3->nodeItem, pIVar2 != (IXML_Node_conflict *)0x0) {
      iVar1 = strcmp(name,pIVar2->nodeName);
      if (iVar1 == 0) {
        if (lVar4 == -0x6b) {
          return (IXML_Node_conflict *)0x0;
        }
        pIVar2 = ixmlNamedNodeMap_item(nnMap,-lVar4);
        return pIVar2;
      }
      lVar4 = lVar4 + -1;
      pIVar3 = (IXML_NamedNodeMap *)&pIVar2->nextSibling;
    }
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_getNamedItem(
	IXML_NamedNodeMap *nnMap, const DOMString name)
{
	unsigned long index;

	if (nnMap == NULL || name == NULL) {
		return NULL;
	}

	index = ixmlNamedNodeMap_getItemNumber(nnMap, name);
	if (index == (unsigned long)IXML_INVALID_ITEM_NUMBER) {
		return NULL;
	} else {
		return ixmlNamedNodeMap_item(nnMap, index);
	}
}